

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenmesh::outedges(tetgenmesh *this,tetgenio *out)

{
  tetrahedron *pppdVar1;
  uint uVar2;
  int iVar3;
  tetrahedron ppdVar4;
  memorypool *this_00;
  point pdVar5;
  bool bVar6;
  bool bVar7;
  int *piVar8;
  long lVar9;
  tetrahedron *pppdVar10;
  tetrahedron *pppdVar11;
  tetgenbehavior *ptVar12;
  int *piVar13;
  size_t sVar14;
  FILE *pFVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  int iVar24;
  uint *puVar25;
  int local_450;
  int local_44c;
  int local_448;
  int local_444;
  double *local_440;
  char edgefilename [1024];
  
  ptVar12 = this->b;
  if (out == (tetgenio *)0x0) {
    strcpy(edgefilename,ptVar12->outfilename);
    sVar14 = strlen(edgefilename);
    builtin_strncpy(edgefilename + sVar14,".edge",6);
    if (ptVar12->quiet == 0) {
      printf("Writing %s.\n",edgefilename);
    }
  }
  else if (ptVar12->quiet == 0) {
    puts("Writing edges.");
  }
  if (this->meshedges == 0) {
    if (this->nonconvex == 0) {
      uVar17 = this->tetrahedrons->items - this->hullsize;
      if (this->b->weighted == 0) {
        lVar9 = 0;
      }
      else {
        lVar9 = this->nonregularcount;
      }
      this->meshedges =
           (~uVar17 + this->points->items + (long)(this->hullsize + uVar17 * 4) / 2) -
           (this->dupverts + this->unuverts + lVar9);
    }
    else {
      numberedges(this);
    }
  }
  this->meshhulledges = 0;
  uVar17 = 0xffffffffffffffff;
  if (out == (tetgenio *)0x0) {
    pFVar15 = fopen(edgefilename,"w");
    if (pFVar15 == (FILE *)0x0) {
      printf("File I/O Error:  Cannot create file %s.\n",edgefilename);
      terminatetetgen(this,1);
    }
    fprintf(pFVar15,"%ld  %d\n",this->meshedges,(ulong)(this->b->nobound == 0));
    ptVar12 = this->b;
  }
  else {
    uVar23 = this->meshedges;
    out->numberofedges = (int)uVar23;
    piVar8 = (int *)operator_new__(-(ulong)((uVar23 & 0x6000000000000000) != 0) | uVar23 * 8);
    out->edgelist = piVar8;
    ptVar12 = this->b;
    if (ptVar12->order == 2) {
      uVar20 = uVar23 * 4;
      if (0x3fffffffffffffff < uVar23) {
        uVar20 = uVar17;
      }
      piVar8 = (int *)operator_new__(uVar20);
      out->o2edgelist = piVar8;
    }
    if (ptVar12->nobound == 0) {
      uVar20 = uVar23 * 4;
      if (0x3fffffffffffffff < uVar23) {
        uVar20 = uVar17;
      }
      piVar8 = (int *)operator_new__(uVar20);
      out->edgemarkerlist = piVar8;
    }
    if (1 < ptVar12->neighout) {
      uVar20 = uVar23 * 4;
      if (0x3fffffffffffffff < uVar23) {
        uVar20 = uVar17;
      }
      piVar8 = (int *)operator_new__(uVar20);
      out->edge2tetlist = piVar8;
    }
    pFVar15 = (FILE *)0x0;
  }
  if (ptVar12->neighout < 2) {
    piVar8 = (int *)0x0;
  }
  else {
    lVar9 = this->tetrahedrons->items - this->hullsize;
    uVar23 = lVar9 * 0x18;
    if (0x3fffffffffffffff < (ulong)(lVar9 * 6)) {
      uVar23 = uVar17;
    }
    piVar8 = (int *)operator_new__(uVar23);
  }
  uVar2 = this->in->firstnumber;
  uVar19 = 0;
  if (ptVar12->zeroindex == 0) {
    uVar19 = uVar2;
  }
  uVar18 = (uint)(uVar2 == 1 && uVar19 == 0);
  memorypool::traversalinit(this->tetrahedrons);
  pppdVar10 = tetrahedrontraverse(this);
  local_440 = (double *)0x0;
  local_448 = 0;
  local_44c = 0;
  local_450 = 0;
  local_444 = 0;
  uVar2 = uVar19;
  while (pppdVar10 != (tetrahedron *)0x0) {
    for (lVar9 = 0; lVar9 != 6; lVar9 = lVar9 + 1) {
      iVar24 = edge2ver[lVar9];
      pppdVar11 = (tetrahedron *)((ulong)pppdVar10[facepivot1[iVar24]] & 0xfffffffffffffff0);
      piVar13 = facepivot2[iVar24] + ((uint)pppdVar10[facepivot1[iVar24]] & 0xf);
      bVar6 = false;
      do {
        bVar7 = true;
        if ((pppdVar11[7] != (tetrahedron)this->dummypoint) &&
           (bVar7 = bVar6, *(int *)(pppdVar11 + 10) < *(int *)(pppdVar10 + 10))) {
          if (pppdVar11 != pppdVar10) goto LAB_00145aa9;
          break;
        }
        bVar6 = bVar7;
        pppdVar1 = pppdVar11 + facepivot1[*piVar13];
        pppdVar11 = (tetrahedron *)((ulong)*pppdVar1 & 0xfffffffffffffff0);
        piVar13 = facepivot2[*piVar13] + ((uint)*pppdVar1 & 0xf);
      } while (pppdVar10 != pppdVar11);
      if (bVar6) {
        this->meshhulledges = this->meshhulledges + 1;
      }
      ppdVar4 = pppdVar10[destpivot[iVar24]];
      ptVar12 = this->b;
      if (ptVar12->order == 2) {
        local_440 = pppdVar10[0xb][ver2edge[iVar24]];
      }
      uVar16 = *(int *)((long)pppdVar10[orgpivot[iVar24]] + (long)this->pointmarkindex * 4) - uVar18
      ;
      if (out == (tetgenio *)0x0) {
        fprintf(pFVar15,"%5d   %4d  %4d",(ulong)uVar2,(ulong)uVar16,
                (ulong)(*(int *)((long)ppdVar4 + (long)this->pointmarkindex * 4) - uVar18));
        ptVar12 = this->b;
        if (ptVar12->order == 2) {
          fprintf(pFVar15,"  %4d",
                  (ulong)(*(int *)((long)local_440 + (long)this->pointmarkindex * 4) - uVar18));
          ptVar12 = this->b;
        }
      }
      else {
        piVar13 = out->edgelist;
        lVar21 = (long)local_444;
        piVar13[lVar21] = uVar16;
        local_444 = local_444 + 2;
        piVar13[lVar21 + 1] = *(int *)((long)ppdVar4 + (long)this->pointmarkindex * 4) - uVar18;
        if (ptVar12->order == 2) {
          lVar21 = (long)local_44c;
          local_44c = local_44c + 1;
          out->o2edgelist[lVar21] =
               *(int *)((long)local_440 + (long)this->pointmarkindex * 4) - uVar18;
        }
      }
      if (ptVar12->nobound == 0) {
        if ((ptVar12->plc == 0) && (ptVar12->refine == 0)) {
          uVar16 = (uint)bVar6;
        }
        else {
          uVar16 = 0;
          if ((pppdVar10[8] != (tetrahedron)0x0) &&
             (uVar17 = (ulong)pppdVar10[8][ver2edge[iVar24]] & 0xfffffffffffffff8, uVar17 != 0)) {
            uVar16 = *(uint *)(uVar17 + (long)this->shmarkindex * 4);
          }
        }
        if (out == (tetgenio *)0x0) {
          fprintf(pFVar15,"  %d");
          if (1 < this->b->neighout) goto LAB_001459f4;
          goto LAB_00145a7f;
        }
        lVar21 = (long)local_450;
        local_450 = local_450 + 1;
        out->edgemarkerlist[lVar21] = uVar16;
        if (1 < ptVar12->neighout) goto LAB_001459b2;
      }
      else {
        if (1 < ptVar12->neighout) {
          if (out == (tetgenio *)0x0) {
LAB_001459f4:
            fprintf(pFVar15,"  %d",(ulong)*(uint *)(pppdVar10 + 10));
          }
          else {
LAB_001459b2:
            lVar21 = (long)local_448;
            local_448 = local_448 + 1;
            out->edge2tetlist[lVar21] = *(int *)(pppdVar10 + 10);
          }
          ppdVar4 = (tetrahedron)this->dummypoint;
          pppdVar11 = pppdVar10;
          do {
            if (pppdVar11[7] != ppdVar4) {
              piVar8[(long)ver2edge[iVar24] +
                     ((long)*(int *)(pppdVar11 + 10) - (long)(int)uVar19) * 6] = uVar2;
            }
            pppdVar1 = pppdVar11 + facepivot1[iVar24];
            pppdVar11 = (tetrahedron *)((ulong)*pppdVar1 & 0xfffffffffffffff0);
            iVar24 = facepivot2[iVar24][(uint)*pppdVar1 & 0xf];
          } while (pppdVar10 != pppdVar11);
        }
        if (out == (tetgenio *)0x0) {
LAB_00145a7f:
          fputc(10,pFVar15);
        }
      }
      uVar2 = uVar2 + 1;
LAB_00145aa9:
    }
    pppdVar10 = tetrahedrontraverse(this);
  }
  if (out == (tetgenio *)0x0) {
    fprintf(pFVar15,"# Generated by %s\n",this->b->commandline);
    fclose(pFVar15);
  }
  ptVar12 = this->b;
  if (ptVar12->neighout < 2) {
    return;
  }
  this_00 = this->tetrahedrons;
  lVar9 = this_00->items - this->hullsize;
  if (ptVar12->facesout != 0) {
    lVar21 = (this->hullsize + lVar9 * 4) / 2;
    uVar17 = lVar21 * 0xc;
    if (0x3fffffffffffffff < (ulong)(lVar21 * 3)) {
      uVar17 = 0xffffffffffffffff;
    }
    piVar13 = (int *)operator_new__(uVar17);
    memorypool::traversalinit(this_00);
    iVar24 = 0;
    while (pppdVar10 = tetrahedrontraverse(this), pppdVar10 != (tetrahedron *)0x0) {
      pdVar5 = this->dummypoint;
      for (uVar17 = 0; uVar17 != 4; uVar17 = uVar17 + 1) {
        iVar3 = *(int *)(pppdVar10 + 10);
        if ((*(point *)(((ulong)pppdVar10[uVar17] & 0xfffffffffffffff0) + 0x38) == pdVar5) ||
           (iVar3 < *(int *)(((ulong)pppdVar10[uVar17] & 0xfffffffffffffff0) + 0x50))) {
          uVar23 = uVar17 & 0xffffffff;
          for (lVar22 = 0; lVar22 != 3; lVar22 = lVar22 + 1) {
            uVar23 = (ulong)enexttbl[(int)uVar23];
            piVar13[iVar24 * 3 + lVar22] =
                 piVar8[(long)ver2edge[uVar23] + (long)(int)(iVar3 - uVar19) * 6];
          }
          iVar24 = iVar24 + 1;
        }
      }
    }
    ptVar12 = this->b;
    if (out != (tetgenio *)0x0) {
      if (ptVar12->quiet == 0) {
        puts("Writing face-to-edge map.");
        ptVar12 = this->b;
      }
      out->face2edgelist = piVar13;
      goto LAB_00145d2a;
    }
    strcpy(edgefilename,ptVar12->outfilename);
    sVar14 = strlen(edgefilename);
    builtin_strncpy(edgefilename + sVar14,".f2e",5);
    if (ptVar12->quiet == 0) {
      printf("Writing %s.\n",edgefilename);
    }
    pFVar15 = fopen(edgefilename,"w");
    if (lVar21 < 1) {
      lVar21 = 0;
    }
    puVar25 = (uint *)(piVar13 + 2);
    for (lVar22 = 0; lVar21 != lVar22; lVar22 = lVar22 + 1) {
      fprintf(pFVar15,"%4d  %d %d %d\n",(ulong)(uint)(this->in->firstnumber + (int)lVar22),
              (ulong)puVar25[-2],(ulong)puVar25[-1],(ulong)*puVar25);
      puVar25 = puVar25 + 3;
    }
    fclose(pFVar15);
    operator_delete__(piVar13);
    ptVar12 = this->b;
  }
  if (out == (tetgenio *)0x0) {
    strcpy(edgefilename,ptVar12->outfilename);
    sVar14 = strlen(edgefilename);
    builtin_strncpy(edgefilename + sVar14,".t2e",5);
    if (ptVar12->quiet == 0) {
      printf("Writing %s.\n",edgefilename);
    }
    pFVar15 = fopen(edgefilename,"w");
    if (lVar9 < 1) {
      lVar9 = 0;
    }
    puVar25 = (uint *)(piVar8 + 5);
    for (lVar21 = 0; lVar9 != lVar21; lVar21 = lVar21 + 1) {
      fprintf(pFVar15,"%4d  %d %d %d %d %d %d\n",(ulong)(uint)(this->in->firstnumber + (int)lVar21),
              (ulong)puVar25[-5],(ulong)puVar25[-4],(ulong)puVar25[-3],(ulong)puVar25[-2],
              (ulong)puVar25[-1],(ulong)*puVar25);
      puVar25 = puVar25 + 6;
    }
    fclose(pFVar15);
    if (piVar8 == (int *)0x0) {
      return;
    }
    operator_delete__(piVar8);
    return;
  }
LAB_00145d2a:
  if (ptVar12->quiet == 0) {
    puts("Writing tetrahedron-to-edge map.");
  }
  out->tet2edgelist = piVar8;
  return;
}

Assistant:

void tetgenmesh::outedges(tetgenio* out)
{
  FILE *outfile = NULL;
  char edgefilename[FILENAMESIZE];
  triface tetloop, worktet, spintet;
  face checkseg;
  point torg, tdest;
  int ishulledge;
  int firstindex, shift;
  int edgenumber, marker;
  int index = 0, index1 = 0, index2 = 0;
  int t1ver;
  int i;

  // For -o2 option.
  point *extralist, pp = NULL; 
  int highorderindex = 11;
  int o2index = 0;

  // For -nn option.
  int *tet2edgelist = NULL;
  int tidx;

  if (out == (tetgenio *) NULL) {
    strcpy(edgefilename, b->outfilename);
    strcat(edgefilename, ".edge");
  }

  if (!b->quiet) {
    if (out == (tetgenio *) NULL) {
      printf("Writing %s.\n", edgefilename);
    } else {
      printf("Writing edges.\n");
    }
  }

  if (meshedges == 0l) {
    if (nonconvex) {
      numberedges();  // Count the edges.
    } else {
      // Use Euler's characteristic to get the numbe of edges.
      // It states V - E + F - C = 1, hence E = V + F - C - 1.
      long tsize = tetrahedrons->items - hullsize;
      long fsize = (tsize * 4l + hullsize) / 2l;
      long vsize = points->items - dupverts - unuverts;
      if (b->weighted) vsize -= nonregularcount;
      meshedges = vsize + fsize - tsize - 1;
    }
  }
  meshhulledges = 0l; // It will be counted.

  if (out == (tetgenio *) NULL) {
    outfile = fopen(edgefilename, "w");
    if (outfile == (FILE *) NULL) {
      printf("File I/O Error:  Cannot create file %s.\n", edgefilename);
      terminatetetgen(this, 1);
    }
    // Write the number of edges, boundary markers (0 or 1).
    fprintf(outfile, "%ld  %d\n", meshedges, !b->nobound);
  } else {
    // Allocate memory for 'edgelist'.
    out->numberofedges = meshedges;
    out->edgelist = new int[meshedges * 2];
    if (out->edgelist == (int *) NULL) {
      printf("Error:  Out of memory.\n");
      terminatetetgen(this, 1);
    }
    if (b->order == 2) { // -o2 switch
      out->o2edgelist = new int[meshedges];
    }
    if (!b->nobound) {
      out->edgemarkerlist = new int[meshedges];
    }
    if (b->neighout > 1) { // '-nn' switch.
      out->edge2tetlist = new int[meshedges];
    }
  }

  if (b->neighout > 1) { // -nn option
    // Output the tetrahedron-to-edge map.
	long tsize = tetrahedrons->items - hullsize;
    tet2edgelist = new int[tsize * 6];
  }

  // Determine the first index (0 or 1).
  firstindex = b->zeroindex ? 0 : in->firstnumber;
  shift = 0; // Default no shiftment.
  if ((in->firstnumber == 1) && (firstindex == 0)) {
    shift = 1; // Shift (reduce) the output indices by 1.
  }

  tetrahedrons->traversalinit();
  tetloop.tet = tetrahedrontraverse();
  edgenumber = firstindex; // in->firstnumber;
  while (tetloop.tet != (tetrahedron *) NULL) {
    // Count the number of Voronoi faces. 
    worktet.tet = tetloop.tet;
    for (i = 0; i < 6; i++) {
      worktet.ver = edge2ver[i];
      ishulledge = 0;
      fnext(worktet, spintet);
      do {
        if (!ishulltet(spintet)) {
          if (elemindex(spintet.tet) < elemindex(worktet.tet)) break;
        } else {
          ishulledge = 1;
        }
        fnextself(spintet);
      } while (spintet.tet != worktet.tet);
      if (spintet.tet == worktet.tet) {
        // Found a new edge.
        if (ishulledge) meshhulledges++;
        torg = org(worktet);
        tdest = dest(worktet);
        if (b->order == 2) { // -o2
          // Get the extra vertex on this edge.
          extralist = (point *) worktet.tet[highorderindex];
          pp = extralist[ver2edge[worktet.ver]];
        }
        if (out == (tetgenio *) NULL) {
          fprintf(outfile, "%5d   %4d  %4d", edgenumber,
                  pointmark(torg) - shift, pointmark(tdest) - shift);
          if (b->order == 2) { // -o2
            fprintf(outfile, "  %4d", pointmark(pp) - shift);
          }
        } else {
          // Output three vertices of this face;
          out->edgelist[index++] = pointmark(torg) - shift;
          out->edgelist[index++] = pointmark(tdest) - shift;
          if (b->order == 2) { // -o2
            out->o2edgelist[o2index++] = pointmark(pp) - shift;
          }
        }
        if (!b->nobound) {
          if (b->plc || b->refine) {
            // Check if the edge is a segment.
            tsspivot1(worktet, checkseg);
            if (checkseg.sh != NULL) {
              marker = shellmark(checkseg);
            } else {
              marker = 0;  // It's not a segment.
            }
          } else {
            // Mark it if it is a hull edge.
            marker = ishulledge ? 1 : 0;
          }
          if (out == (tetgenio *) NULL) {
            fprintf(outfile, "  %d", marker);
          } else {
            out->edgemarkerlist[index1++] = marker;
          }
        }
        if (b->neighout > 1) { // '-nn' switch.
          if (out == (tetgenio *) NULL) {
            fprintf(outfile, "  %d", elemindex(tetloop.tet));
          } else {
            out->edge2tetlist[index2++] = elemindex(tetloop.tet);
          }
		  // Fill the tetrahedron-to-edge map.
		  spintet = worktet;
		  while (1) {
		    if (!ishulltet(spintet)) {
			  tidx = elemindex(spintet.tet) - firstindex;
			  tet2edgelist[tidx * 6 + ver2edge[spintet.ver]] = edgenumber;
			}
		    fnextself(spintet);
			if (spintet.tet == worktet.tet) break;
		  }
        }
        if (out == (tetgenio *) NULL) {
          fprintf(outfile, "\n");
        }
        edgenumber++;
      }
    }
    tetloop.tet = tetrahedrontraverse();
  }

  if (out == (tetgenio *) NULL) {
    fprintf(outfile, "# Generated by %s\n", b->commandline);
    fclose(outfile);
  }

  if (b->neighout > 1) { // -nn option
    long tsize = tetrahedrons->items - hullsize;

    if (b->facesout) { // -f option
      // Build the face-to-edge map (use the tet-to-edge map).
	  long fsize = (tsize * 4l + hullsize) / 2l;
	  int *face2edgelist = new int[fsize * 3];

	  tetrahedrons->traversalinit();
      tetloop.tet = tetrahedrontraverse();
      int facenumber = 0; // firstindex; // in->firstnumber;
	  while (tetloop.tet != (tetrahedron *) NULL) {
	    for (tetloop.ver = 0; tetloop.ver < 4; tetloop.ver++) {
		  fsym(tetloop, spintet);
		  if (ishulltet(spintet) || 
              (elemindex(tetloop.tet) < elemindex(spintet.tet))) {
            // The three edges of this face are ordered such that the
			//    first edge is opposite to the first vertex of this face
			//    that appears in the .face file, and so on.
			tidx = elemindex(tetloop.tet) - firstindex; 
			worktet = tetloop;
            for (i = 0; i < 3; i++) {
			  enextself(worktet); // The edge opposite to vertex i.
			  int eidx = tet2edgelist[tidx * 6 + ver2edge[worktet.ver]];
			  face2edgelist[facenumber * 3 + i] = eidx;
			}
		    facenumber++;
		  }
		}
	    tetloop.tet = tetrahedrontraverse();
	  }

	  // Output the face-to-edge map.
	  if (out == (tetgenio *) NULL) {
	    strcpy(edgefilename, b->outfilename);
        strcat(edgefilename, ".f2e");
      }
	  if (!b->quiet) {
        if (out == (tetgenio *) NULL) {
          printf("Writing %s.\n", edgefilename);
        } else {
          printf("Writing face-to-edge map.\n");
        }
      }
	  if (out == (tetgenio *) NULL) {
	    outfile = fopen(edgefilename, "w");
	    for (tidx = 0; tidx < fsize; tidx++) { // Re-use `tidx'
	      i = tidx * 3;
		  fprintf(outfile, "%4d  %d %d %d\n", tidx + in->firstnumber,
		          face2edgelist[i], face2edgelist[i+1], face2edgelist[i+2]);
	    }
	    fclose(outfile);
	    delete [] face2edgelist;
	  } else {
	    // Simply copy the address of the list to the output.
	    out->face2edgelist = face2edgelist;
      }
    } // if (b->facesout)

    // Output the tetrahedron-to-edge map.
	if (out == (tetgenio *) NULL) {
	  strcpy(edgefilename, b->outfilename);
      strcat(edgefilename, ".t2e");
    }
	if (!b->quiet) {
      if (out == (tetgenio *) NULL) {
        printf("Writing %s.\n", edgefilename);
      } else {
        printf("Writing tetrahedron-to-edge map.\n");
      }
    }
	if (out == (tetgenio *) NULL) {
	  outfile = fopen(edgefilename, "w");
	  for (tidx = 0; tidx < tsize; tidx++) {
	    i = tidx * 6;
		fprintf(outfile, "%4d  %d %d %d %d %d %d\n", tidx + in->firstnumber,
		        tet2edgelist[i], tet2edgelist[i+1], tet2edgelist[i+2],  
				tet2edgelist[i+3], tet2edgelist[i+4], tet2edgelist[i+5]);
	  }
	  fclose(outfile);
	  delete [] tet2edgelist;
	} else {
	  // Simply copy the address of the list to the output.
	  out->tet2edgelist = tet2edgelist;
    }
  }
}